

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

void ssh1_connection_process_queue(PacketProtocolLayer *ppl)

{
  int iVar1;
  uint uVar2;
  Ssh *ssh;
  PktIn *pPVar3;
  _Bool _Var4;
  prompts_t *ppVar5;
  InteractionReadySeat iseat;
  char *pcVar6;
  SeatPromptResult local_70;
  Seat *local_50;
  SeatPromptResult local_48;
  PktIn *local_28;
  int *crLine;
  PktIn *pktin;
  ssh1_connection_state *s;
  PacketProtocolLayer *ppl_local;
  
  pktin = (PktIn *)&ppl[-3].seat;
  s = (ssh1_connection_state *)ppl;
  _Var4 = ssh1_connection_filter_queue((ssh1_connection_state *)pktin);
  pPVar3 = pktin;
  if (_Var4) {
    return;
  }
  local_28 = pktin;
  iVar1 = pktin->type;
  if (iVar1 == 0) {
    _Var4 = ssh1_connection_need_antispoof_prompt((ssh1_connection_state *)pktin);
    if (_Var4) {
      ppVar5 = ssh_ppl_new_prompts((PacketProtocolLayer *)&pktin[2].binarysource_[0].len);
      *(prompts_t **)(pktin + 2) = ppVar5;
      **(undefined1 **)(pktin + 2) = 1;
      *(undefined1 *)(*(long *)(pktin + 2) + 1) = 0;
      pcVar6 = dupstr("Authentication successful");
      *(char **)(*(long *)(pktin + 2) + 8) = pcVar6;
      ppVar5 = *(prompts_t **)(pktin + 2);
      pcVar6 = dupstr("Access granted. Press Return to begin session. ");
      add_prompt(ppVar5,pcVar6,false);
      pPVar3 = pktin;
      local_50 = (Seat *)ppl_get_iseat((PacketProtocolLayer *)&pktin[2].binarysource_[0].len);
      seat_get_userpass_input(&local_48,(InteractionReadySeat)local_50,*(prompts_t **)(pktin + 2));
      pPVar3[2].sequence = local_48._0_8_;
      pPVar3[2].qnode.next = (PacketQueueNode *)local_48.errfn;
      pPVar3[2].qnode.prev = (PacketQueueNode *)local_48.errdata_lit;
      pPVar3[2].qnode.formal_size = local_48._24_8_;
      goto LAB_0012d49b;
    }
LAB_0012d54d:
    portfwdmgr_config((PortFwdManager *)pktin[1].binarysource_[0].data,(Conf *)pktin->sequence);
    *(undefined1 *)&pktin[1].binarysource_[0].pos = 1;
  }
  else {
    if (iVar1 == 0x181) {
      iseat = ppl_get_iseat((PacketProtocolLayer *)&pktin[2].binarysource_[0].len);
      seat_get_userpass_input(&local_70,iseat,*(prompts_t **)(pktin + 2));
      pPVar3[2].sequence = local_70._0_8_;
      pPVar3[2].qnode.next = (PacketQueueNode *)local_70.errfn;
      pPVar3[2].qnode.prev = (PacketQueueNode *)local_70.errdata_lit;
      pPVar3[2].qnode.formal_size = local_70._24_8_;
LAB_0012d49b:
      if ((int)pktin[2].sequence == 0) {
        local_28->type = 0x181;
        return;
      }
      free_prompts(*(prompts_t **)(pktin + 2));
      *(undefined8 *)(pktin + 2) = 0;
      goto LAB_0012d54d;
    }
    if (iVar1 != 0x18e) {
      if (iVar1 != 0x19f) {
        pktin->type = 0;
        return;
      }
      goto LAB_0012d59d;
    }
  }
  if (((*(byte *)((long)&pktin[1].binarysource_[0].pos + 1) ^ 0xff) & 1) != 0) {
    ssh1_connection_direction_specific_setup((ssh1_connection_state *)pktin);
    local_28->type = 0x18e;
    return;
  }
LAB_0012d59d:
  crLine = &ssh1_connection_pop((ssh1_connection_state *)pktin)->type;
  if ((PktIn *)crLine == (PktIn *)0x0) {
    local_28->type = 0x19f;
  }
  else {
    ssh = (Ssh *)pktin[3].binarysource_[0].len;
    uVar2 = ((PktIn *)crLine)->type;
    pcVar6 = ssh1_pkt_type(((PktIn *)crLine)->type);
    ssh_proto_error(ssh,"Unexpected packet received, type %d (%s)",(ulong)uVar2,pcVar6);
  }
  return;
}

Assistant:

static void ssh1_connection_process_queue(PacketProtocolLayer *ppl)
{
    struct ssh1_connection_state *s =
        container_of(ppl, struct ssh1_connection_state, ppl);
    PktIn *pktin;

    if (ssh1_connection_filter_queue(s)) /* no matter why we were called */
        return;

    crBegin(s->crState);

    /*
     * Signal the seat that authentication is done, so that it can
     * deploy spoofing defences. If it doesn't have any, deploy our
     * own fallback one.
     *
     * We do this here rather than at the end of userauth, because we
     * might not have gone through userauth at all (if we're a
     * connection-sharing downstream).
     */
    if (ssh1_connection_need_antispoof_prompt(s)) {
        s->antispoof_prompt = ssh_ppl_new_prompts(&s->ppl);
        s->antispoof_prompt->to_server = true;
        s->antispoof_prompt->from_server = false;
        s->antispoof_prompt->name = dupstr("Authentication successful");
        add_prompt(
            s->antispoof_prompt,
            dupstr("Access granted. Press Return to begin session. "), false);
        s->antispoof_ret = seat_get_userpass_input(
            ppl_get_iseat(&s->ppl), s->antispoof_prompt);
        while (s->antispoof_ret.kind == SPRK_INCOMPLETE) {
            crReturnV;
            s->antispoof_ret = seat_get_userpass_input(
                ppl_get_iseat(&s->ppl), s->antispoof_prompt);
        }
        free_prompts(s->antispoof_prompt);
        s->antispoof_prompt = NULL;
    }

    portfwdmgr_config(s->portfwdmgr, s->conf);
    s->portfwdmgr_configured = true;

    while (!s->finished_setup) {
        ssh1_connection_direction_specific_setup(s);
        crReturnV;
    }

    while (1) {

        /*
         * By this point, most incoming packets are already being
         * handled by filter_queue, and we need only pay attention to
         * the unusual ones.
         */

        if ((pktin = ssh1_connection_pop(s)) != NULL) {
            ssh_proto_error(s->ppl.ssh, "Unexpected packet received, "
                            "type %d (%s)", pktin->type,
                            ssh1_pkt_type(pktin->type));
            return;
        }
        crReturnV;
    }

    crFinishV;
}